

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void whereLoopOutputAdjust(WhereClause *pWC,WhereLoop *pLoop,LogEst nRow)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  WhereTerm *pWVar5;
  int iVar6;
  uint uVar7;
  undefined6 in_register_00000012;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  WhereTerm *pWVar12;
  bool bVar13;
  int k;
  uint local_3c;
  WhereClause *local_38;
  
  uVar8 = CONCAT62(in_register_00000012,nRow);
  uVar2 = pLoop->maskSelf;
  uVar3 = pLoop->prereq;
  iVar11 = pWC->nBase;
  pWVar12 = pWC->a;
  uVar9 = 0;
  local_38 = pWC;
  do {
    if (iVar11 < 1) {
      iVar11 = (int)(short)uVar8 - uVar9;
      if (iVar11 < pLoop->nOut) {
        pLoop->nOut = (LogEst)iVar11;
      }
      return;
    }
    uVar4 = pWVar12->prereqAll;
    if ((((uVar4 & ~(uVar2 | uVar3)) == 0) && ((pLoop->maskSelf & uVar4) != 0)) &&
       ((pWVar12->wtFlags & 2) == 0)) {
      uVar10 = (ulong)pLoop->nLTerm;
      while (bVar13 = uVar10 != 0, uVar10 = uVar10 - 1, bVar13) {
        pWVar5 = pLoop->aLTerm[uVar10];
        if ((pWVar5 != (WhereTerm *)0x0) &&
           ((pWVar5 == pWVar12 ||
            ((-1 < (long)pWVar5->iParent && (local_38->a + pWVar5->iParent == pWVar12))))))
        goto LAB_001acb6b;
      }
      if ((pLoop->maskSelf == uVar4) &&
         (((pWVar12->eOperator & 0x3f) != 0 ||
          ((local_38->pWInfo->pTabList->a[pLoop->iTab].fg.jointype & 0x48) == 0)))) {
        pbVar1 = (byte *)((long)&pLoop->wsFlags + 2);
        *pbVar1 = *pbVar1 | 0x80;
      }
      if (pWVar12->truthProb < 1) {
        pLoop->nOut = pLoop->nOut + pWVar12->truthProb;
      }
      else {
        pLoop->nOut = pLoop->nOut + -1;
        if ((pWVar12->eOperator & 0x82) != 0) {
          local_3c = (uint)uVar8;
          k = 0;
          iVar6 = sqlite3ExprIsInteger(pWVar12->pExpr->pRight,&k);
          uVar7 = 0x14;
          if (k + 1U < 3) {
            uVar7 = 10;
          }
          if (iVar6 == 0) {
            uVar7 = 0x14;
          }
          if (uVar9 < uVar7) {
            pbVar1 = (byte *)((long)&pWVar12->wtFlags + 1);
            *pbVar1 = *pbVar1 | 0x20;
            uVar9 = uVar7;
          }
          uVar8 = (ulong)local_3c;
        }
      }
    }
LAB_001acb6b:
    iVar11 = iVar11 + -1;
    pWVar12 = pWVar12 + 1;
  } while( true );
}

Assistant:

static void whereLoopOutputAdjust(
  WhereClause *pWC,      /* The WHERE clause */
  WhereLoop *pLoop,      /* The loop to adjust downward */
  LogEst nRow            /* Number of rows in the entire table */
){
  WhereTerm *pTerm, *pX;
  Bitmask notAllowed = ~(pLoop->prereq|pLoop->maskSelf);
  int i, j;
  LogEst iReduce = 0;    /* pLoop->nOut should not exceed nRow-iReduce */

  assert( (pLoop->wsFlags & WHERE_AUTO_INDEX)==0 );
  for(i=pWC->nBase, pTerm=pWC->a; i>0; i--, pTerm++){
    assert( pTerm!=0 );
    if( (pTerm->prereqAll & notAllowed)!=0 ) continue;
    if( (pTerm->prereqAll & pLoop->maskSelf)==0 ) continue;
    if( (pTerm->wtFlags & TERM_VIRTUAL)!=0 ) continue;
    for(j=pLoop->nLTerm-1; j>=0; j--){
      pX = pLoop->aLTerm[j];
      if( pX==0 ) continue;
      if( pX==pTerm ) break;
      if( pX->iParent>=0 && (&pWC->a[pX->iParent])==pTerm ) break;
    }
    if( j<0 ){
      if( pLoop->maskSelf==pTerm->prereqAll ){
        /* If there are extra terms in the WHERE clause not used by an index
        ** that depend only on the table being scanned, and that will tend to
        ** cause many rows to be omitted, then mark that table as
        ** "self-culling".
        **
        ** 2022-03-24:  Self-culling only applies if either the extra terms
        ** are straight comparison operators that are non-true with NULL
        ** operand, or if the loop is not an OUTER JOIN.
        */
        if( (pTerm->eOperator & 0x3f)!=0
         || (pWC->pWInfo->pTabList->a[pLoop->iTab].fg.jointype
                  & (JT_LEFT|JT_LTORJ))==0
        ){
          pLoop->wsFlags |= WHERE_SELFCULL;
        }
      }
      if( pTerm->truthProb<=0 ){
        /* If a truth probability is specified using the likelihood() hints,
        ** then use the probability provided by the application. */
        pLoop->nOut += pTerm->truthProb;
      }else{
        /* In the absence of explicit truth probabilities, use heuristics to
        ** guess a reasonable truth probability. */
        pLoop->nOut--;
        if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0
         && (pTerm->wtFlags & TERM_HIGHTRUTH)==0  /* tag-20200224-1 */
        ){
          Expr *pRight = pTerm->pExpr->pRight;
          int k = 0;
          testcase( pTerm->pExpr->op==TK_IS );
          if( sqlite3ExprIsInteger(pRight, &k) && k>=(-1) && k<=1 ){
            k = 10;
          }else{
            k = 20;
          }
          if( iReduce<k ){
            pTerm->wtFlags |= TERM_HEURTRUTH;
            iReduce = k;
          }
        }
      }
    }
  }
  if( pLoop->nOut > nRow-iReduce ){
    pLoop->nOut = nRow - iReduce;
  }
}